

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

void __thiscall
libcellml::Parser::ParserImpl::loadUnitsFromComponent
          (ParserImpl *this,ModelPtr *model,XmlNodePtr *node)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  bool bVar2;
  XmlNodePtr childNode;
  UnitsPtr units;
  XmlNodePtr local_48;
  UnitsPtr local_38;
  
  XmlNode::firstChild((XmlNode *)&local_48);
  if ((element_type *)
      local_48.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    do {
      bVar2 = XmlNode::isCellml1XElement
                        (local_48.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr,"units");
      if (bVar2) {
        Units::create();
        loadUnits(this,&local_38,&local_48);
        Model::addUnits((model->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr,&local_38);
        if (local_38.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_38.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
      }
      XmlNode::next((XmlNode *)&local_38);
      _Var1._M_pi = local_38.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      local_48.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           local_38.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      this_00._M_pi =
           local_48.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
      local_38.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_38.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_48.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = _Var1._M_pi;
      if ((this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi),
         local_38.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_38.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
    } while ((element_type *)
             local_48.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
             (element_type *)0x0);
  }
  if (local_48.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void Parser::ParserImpl::loadUnitsFromComponent(const ModelPtr &model, const XmlNodePtr &node)
{
    XmlNodePtr childNode = node->firstChild();
    while (childNode != nullptr) {
        if (childNode->isCellml1XElement("units")) {
            UnitsPtr units = Units::create();
            loadUnits(units, childNode);
            model->addUnits(units);
        }
        childNode = childNode->next();
    }
}